

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O1

long DataSet::random(void)

{
  result_type_conflict *prVar1;
  undefined1 auVar2 [16];
  undefined8 *puVar3;
  ulong uVar4;
  int in_ECX;
  long lVar5;
  ulong in_RDX;
  ulong uVar6;
  float *f;
  result_type_conflict *prVar7;
  size_type in_RSI;
  undefined8 *in_RDI;
  DataSet *pDVar8;
  vector<float,_std::allocator<float>_> *c;
  pointer pfVar9;
  result_type_conflict rVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  vector<float,_std::allocator<float>_> vector;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  aimed_centroids;
  allocator_type local_1422;
  allocator_type local_1421;
  undefined8 *local_1420;
  int local_1414;
  ulong local_1410;
  vector<float,_std::allocator<float>_> local_1408;
  vector<float,_std::allocator<float>_> local_13f0;
  undefined8 *local_13d8;
  undefined8 *local_13d0;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13c8;
  normal_distribution<float> local_40;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_1410 = in_RDX;
  local_13d0 = in_RDI;
  if (in_ECX == -1) {
    local_13c8._M_x[0] = 1;
    uVar4 = 1;
    lVar5 = 1;
    do {
      uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar5);
      local_13c8._M_x[lVar5] = uVar4;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x270);
    local_13c8._M_p = 0x270;
    local_40._M_param._M_mean = 0.0;
    local_40._M_param._M_stddev = 1.0;
    *in_RDI = 0;
    local_1420 = (undefined8 *)operator_new(0x30);
    local_1420[1] = 0x100000001;
    *local_1420 = &PTR___Sp_counted_ptr_inplace_00109cd8;
    pDVar8 = (DataSet *)(local_1420 + 2);
    local_1420[2] = in_RSI;
    local_1420[3] = 0;
    local_1420[4] = 0;
    local_1420[5] = 0;
    in_RDI[1] = local_1420;
    *in_RDI = pDVar8;
    if (local_1410 != 0) {
      uVar4 = 0;
      do {
        std::vector<float,_std::allocator<float>_>::vector
                  (&local_13f0,pDVar8->num_features,(allocator_type *)&local_1408);
        if (pDVar8->num_features != 0) {
          uVar6 = 0;
          do {
            auVar12._0_4_ =
                 std::
                 generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           (&local_13c8);
            auVar12._4_60_ = extraout_var_00;
            auVar2 = vfmadd213ss_fma(auVar12._0_16_,
                                     ZEXT416((uint)(local_40._M_param._M_stddev -
                                                   local_40._M_param._M_mean)),
                                     ZEXT416((uint)local_40._M_param._M_mean));
            local_13f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6] = auVar2._0_4_;
            uVar6 = uVar6 + 1;
          } while (uVar6 < pDVar8->num_features);
        }
        addVector(pDVar8,&local_13f0);
        if (local_13f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_13f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != local_1410);
    }
  }
  else {
    local_13c8._M_x[0] = 1;
    uVar4 = 1;
    lVar5 = 1;
    do {
      uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar5);
      local_13c8._M_x[lVar5] = uVar4;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x270);
    local_13c8._M_p = 0x270;
    local_40._M_param._M_mean = 0.0;
    local_40._M_param._M_stddev = 1.0;
    local_40._M_saved = 0.0;
    local_40._M_saved_available = false;
    local_1414 = in_ECX;
    std::vector<float,_std::allocator<float>_>::vector(&local_1408,in_RSI,&local_1422);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)&local_13f0,(long)local_1414,&local_1408,&local_1421);
    local_1420 = (undefined8 *)in_RSI;
    if (local_1408.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_1408.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_13f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_start !=
        local_13f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      pfVar9 = local_13f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        prVar1 = *(result_type_conflict **)(pfVar9 + 2);
        for (prVar7 = *(result_type_conflict **)pfVar9; prVar7 != prVar1; prVar7 = prVar7 + 1) {
          rVar10 = std::normal_distribution<float>::operator()
                             (&local_40,&local_13c8,&local_40._M_param);
          *prVar7 = rVar10;
        }
        pfVar9 = pfVar9 + 6;
      } while (pfVar9 != local_13f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    puVar3 = local_13d0;
    *local_13d0 = 0;
    local_13d8 = (undefined8 *)operator_new(0x30);
    local_13d8[1] = 0x100000001;
    *local_13d8 = &PTR___Sp_counted_ptr_inplace_00109cd8;
    pDVar8 = (DataSet *)(local_13d8 + 2);
    local_13d8[2] = local_1420;
    local_13d8[3] = 0;
    local_13d8[4] = 0;
    local_13d8[5] = 0;
    puVar3[1] = local_13d8;
    *puVar3 = pDVar8;
    if (local_1410 != 0) {
      uVar4 = 0;
      do {
        std::vector<float,_std::allocator<float>_>::vector
                  (&local_1408,pDVar8->num_features,&local_1422);
        if (pDVar8->num_features != 0) {
          lVar5 = (long)local_1414;
          uVar6 = 0;
          do {
            local_1420 = (undefined8 *)
                         CONCAT44(local_1420._4_4_,
                                  *(undefined4 *)
                                   (*(long *)(local_13f0.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                             ((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 |
                                                    uVar4 & 0xffffffff) % lVar5 & 0xffffffffU) * 6)
                                   + uVar6 * 4));
            auVar11._0_4_ =
                 std::normal_distribution<float>::operator()
                           (&local_40,&local_13c8,&local_40._M_param);
            auVar11._4_60_ = extraout_var;
            auVar2 = vfmadd231ss_fma(ZEXT416((uint)local_1420),auVar11._0_16_,ZEXT416(0x3e800000));
            local_1408.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6] = auVar2._0_4_;
            uVar6 = uVar6 + 1;
          } while (uVar6 < pDVar8->num_features);
        }
        addVector(pDVar8,&local_1408);
        if (local_1408.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1408.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != local_1410);
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)&local_13f0);
  }
  return (long)local_13d0;
}

Assistant:

std::shared_ptr<DataSet> DataSet::random(size_t num_features, size_t num_vectors, int num_clusters) {

  // Fully randomize feature vectors if number of centroids is negative.
  if (num_clusters == -1) {

    UniformRandomGenerator<float> rg(1);

    auto ds = std::make_shared<DataSet>(num_features);

    for (int i = 0; i < num_vectors; i++) {
      std::vector<float> vector(ds->num_features);
      for (int f = 0; f < ds->num_features; f++) {
        vector[f] = rg.next();
      }
      ds->addVector(vector);
    }
    return ds;
  } else {
    NormalRandomGenerator<float> rg(1);
    // Sort of randomize the data to lie around some centroids
    std::vector<std::vector<float>> aimed_centroids(
        static_cast<unsigned long>(num_clusters),
        std::vector<float>(num_features));

    // Generate some random centroids
    for (auto &c : aimed_centroids) {
      for (auto &f: c) {
        f = rg.next();
      }
    }

    // Create a new data set
    auto ds = std::make_shared<DataSet>(num_features);

    for (int i = 0; i < num_vectors; i++) {
      std::vector<float> vector(ds->num_features);
      for (int f = 0; f < ds->num_features; f++) {
        vector[f] = aimed_centroids[i % num_clusters][f] + 0.25f * rg.next();
      }
      ds->addVector(vector);
    }
    return ds;
  }
}